

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaCuFunc.cpp
# Opt level: O2

void __thiscall NaCustomFunc::Clean(NaCustomFunc *this)

{
  if (this->szFile != (char *)0x0) {
    operator_delete__(this->szFile);
    this->szFile = (char *)0x0;
  }
  if (this->szOptions != (char *)0x0) {
    operator_delete__(this->szOptions);
    this->szOptions = (char *)0x0;
  }
  NaVector::new_dim(&this->vInitial,0);
  if (this->exfunc != (NaExternFunc *)0x0) {
    (*(this->exfunc->super_NaUnit).super_NaLogging._vptr_NaLogging[2])();
    this->exfunc = (NaExternFunc *)0x0;
  }
  if (this->so != (void *)0x0) {
    dlclose();
    this->so = (void *)0x0;
  }
  return;
}

Assistant:

void
NaCustomFunc::Clean ()
{
  if(NULL != szFile){
    delete[] szFile;
    szFile = NULL;
  }
  if(NULL != szOptions){
    delete[] szOptions;
    szOptions = NULL;
  }
  vInitial.new_dim(0);

  if(NULL != exfunc){
    delete exfunc;
    exfunc = NULL;
  }
  if(NULL != so){
#ifdef WIN32
    FreeLibrary(so);
#else
    dlclose(so);
#endif
    so = NULL;
  }
}